

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O2

S2Cap * __thiscall S2Cap::Expanded(S2Cap *__return_storage_ptr__,S2Cap *this,S1Angle distance)

{
  S1ChordAngle SVar1;
  S1ChordAngle local_30;
  S2LogMessage local_28;
  
  if (0.0 <= distance.radians_) {
    SVar1.length2_ = (this->radius_).length2_;
    if (0.0 <= SVar1.length2_) {
      S1ChordAngle::S1ChordAngle(&local_30,distance);
      SVar1 = operator+(SVar1,local_30);
      S2Cap(__return_storage_ptr__,&this->center_,SVar1);
    }
    else {
      S2Cap(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
             ,0x6d,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_28.stream_,"Check failed: (distance.radians()) >= (0) ");
  abort();
}

Assistant:

S2Cap S2Cap::Expanded(S1Angle distance) const {
  S2_DCHECK_GE(distance.radians(), 0);
  if (is_empty()) return Empty();
  return S2Cap(center_, radius_ + S1ChordAngle(distance));
}